

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.cpp
# Opt level: O0

void duckdb_zstd::ZSTD_optLdm_processMatchCandidate
               (ZSTD_optLdm_t *optLdm,ZSTD_match_t *matches,U32 *nbMatches,U32 currPosInBlock,
               U32 remainingBytes)

{
  uint in_ECX;
  U32 *in_RDX;
  ZSTD_match_t *in_RSI;
  ZSTD_optLdm_t *in_RDI;
  U32 posOvershoot;
  ZSTD_optLdm_t *unaff_retaddr;
  
  if (((in_RDI->seqStore).size != 0) && ((in_RDI->seqStore).pos < (in_RDI->seqStore).size)) {
    if (in_RDI->endPosInBlock <= in_ECX) {
      if (in_RDI->endPosInBlock < in_ECX) {
        ZSTD_optLdm_skipRawSeqStoreBytes(&in_RDI->seqStore,(ulong)(in_ECX - in_RDI->endPosInBlock));
      }
      ZSTD_opt_getNextMatchAndUpdateSeqStore(unaff_retaddr,(U32)((ulong)in_RDI >> 0x20),(U32)in_RDI)
      ;
    }
    ZSTD_optLdm_maybeAddMatch(in_RSI,in_RDX,in_RDI,in_ECX);
  }
  return;
}

Assistant:

static void
ZSTD_optLdm_processMatchCandidate(ZSTD_optLdm_t* optLdm,
                                  ZSTD_match_t* matches, U32* nbMatches,
                                  U32 currPosInBlock, U32 remainingBytes)
{
    if (optLdm->seqStore.size == 0 || optLdm->seqStore.pos >= optLdm->seqStore.size) {
        return;
    }

    if (currPosInBlock >= optLdm->endPosInBlock) {
        if (currPosInBlock > optLdm->endPosInBlock) {
            /* The position at which ZSTD_optLdm_processMatchCandidate() is called is not necessarily
             * at the end of a match from the ldm seq store, and will often be some bytes
             * over beyond matchEndPosInBlock. As such, we need to correct for these "overshoots"
             */
            U32 const posOvershoot = currPosInBlock - optLdm->endPosInBlock;
            ZSTD_optLdm_skipRawSeqStoreBytes(&optLdm->seqStore, posOvershoot);
        }
        ZSTD_opt_getNextMatchAndUpdateSeqStore(optLdm, currPosInBlock, remainingBytes);
    }
    ZSTD_optLdm_maybeAddMatch(matches, nbMatches, optLdm, currPosInBlock);
}